

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero(void)

{
  int iVar1;
  void **head;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> local_68;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_40;
  RationalConstantType local_30;
  
  if ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p
                                 ), iVar1 != 0)) {
    RationalConstantType::RationalConstantType(&local_30,0);
    local_68._factors._capacity = 0;
    local_68._factors._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0
    ;
    local_68._factors._end = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    local_68._factors._stack = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
    ::Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)&local_40,&local_68);
    Monom(&zero::p,&local_30,&local_40);
    MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::~MonomFactors(&local_68);
    RationalConstantType::~RationalConstantType(&local_30);
    __cxa_atexit(~Monom,&zero::p,&__dso_handle);
    __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
  }
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)in_RDI,(IntegerConstantType *)&zero::p);
  IntegerConstantType::IntegerConstantType(&(in_RDI->numeral)._den,&zero::p.numeral._den);
  (in_RDI->factors)._id = zero::p.factors._id;
  (in_RDI->factors)._ptr = zero::p.factors._ptr;
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}